

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O1

Vec_Wrd_t * Vec_WrdStartRandom(int nSize)

{
  Vec_Wrd_t *pVVar1;
  word *__s;
  word wVar2;
  int iVar3;
  ulong uVar4;
  
  pVVar1 = (Vec_Wrd_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < nSize - 1U) {
    iVar3 = nSize;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar3;
  if (iVar3 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar3 << 3);
  }
  pVVar1->pArray = __s;
  pVVar1->nSize = nSize;
  memset(__s,0,(long)nSize << 3);
  if (0 < nSize) {
    uVar4 = 0;
    do {
      wVar2 = Abc_RandomW(0);
      __s[uVar4] = wVar2;
      uVar4 = uVar4 + 1;
    } while ((uint)nSize != uVar4);
  }
  return pVVar1;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdStartRandom( int nSize )
{
    Vec_Wrd_t * vSims = Vec_WrdStart( nSize ); int i;
    for ( i = 0; i < nSize; i++ )
        vSims->pArray[i] = Abc_RandomW(0);
    return vSims;
}